

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

NumericExpr __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::ReadNumericExpr(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *this,char code,bool ignore_zero)

{
  CallArgHandler handler;
  byte bVar1;
  int iVar2;
  int iVar3;
  NumericExpr NVar4;
  ExprBase other;
  byte in_DL;
  char in_SIL;
  NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  *in_RDI;
  double dVar5;
  double value;
  int i;
  CallArgHandler args;
  int num_args;
  int func_index;
  int in_stack_00000164;
  NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  *in_stack_00000168;
  BasicIteratedExprBuilder<mp::CallExpr> *in_stack_ffffffffffffff68;
  ExprBase in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  TextReader<fmt::Locale> *in_stack_ffffffffffffff90;
  TextReader<fmt::Locale> *in_stack_ffffffffffffff98;
  CStringRef in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *in_stack_ffffffffffffffb0;
  int local_44;
  undefined2 in_stack_ffffffffffffffec;
  ExprBase local_8;
  
  bVar1 = in_DL & 1;
  other.impl_._4_4_ = 0;
  other.impl_._0_4_ = (int)in_SIL - 0x66;
  switch(other.impl_) {
  case (Impl *)0x0:
    iVar2 = ReadUInt((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                      *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    iVar3 = TextReader<fmt::Locale>::ReadUInt((TextReader<fmt::Locale> *)0x6cc848);
    TextReader<fmt::Locale>::ReadTillEndOfLine(in_stack_ffffffffffffff90);
    NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::BeginCall
              (in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
               (int)in_stack_ffffffffffffffa8);
    for (local_44 = 0; local_44 < iVar3; local_44 = local_44 + 1) {
      ReadSymbolicExpr((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                        *)CONCAT17(in_SIL,CONCAT16(bVar1,CONCAT24(in_stack_ffffffffffffffec,iVar2)))
                      );
      BasicExprFactory<std::allocator<char>_>::BasicIteratedExprBuilder<mp::CallExpr>::AddArg
                (in_stack_ffffffffffffff68,(Arg)in_stack_ffffffffffffff70.impl_);
    }
    handler.arg_index_ = in_stack_ffffffffffffff88;
    handler.impl_ = (Impl *)other.impl_;
    handler._12_4_ = in_stack_ffffffffffffff8c;
    local_8.impl_ =
         (Impl *)NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::EndCall
                           ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
                            in_RDI,handler);
    break;
  default:
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffff88,"expected expression");
    TextReader<fmt::Locale>::ReportError<>(in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0);
    goto LAB_006cc9cc;
  case (Impl *)0x6:
  case (Impl *)0x8:
  case (Impl *)0xd:
    dVar5 = ReadConstant((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                          *)in_stack_ffffffffffffff90,(char)(in_stack_ffffffffffffff8c >> 0x18));
    if ((((bVar1 & 1) == 0) || (dVar5 != 0.0)) || (NAN(dVar5))) {
      NVar4 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnNumber
                        ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)in_RDI
                         ,(double)in_stack_ffffffffffffff70.impl_);
      return (NumericExpr)(Impl *)NVar4.super_ExprBase.impl_;
    }
LAB_006cc9cc:
    BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr
              ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)0x6cc9d9);
    break;
  case (Impl *)0x9:
    ReadOpCode((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                *)other.impl_);
    local_8.impl_ = (Impl *)ReadNumericExpr(in_stack_00000168,in_stack_00000164);
    break;
  case (Impl *)0x10:
    DoReadReference(in_RDI);
    BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::Reference>
              ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_RDI,(Reference)other.impl_,
               (type_conflict)((ulong)in_stack_ffffffffffffff70.impl_ >> 0x20));
  }
  return (NumericExpr)(ExprBase)local_8.impl_;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(char code, bool ignore_zero) {
  switch (code) {
  case 'f': {
    // Read a function call.
    int func_index = ReadUInt(header_.num_funcs);
    int num_args = reader_.ReadUInt();
    reader_.ReadTillEndOfLine();
    typename Handler::CallArgHandler args =
        handler_.BeginCall(func_index, num_args);
    for (int i = 0; i < num_args; ++i)
      args.AddArg(ReadSymbolicExpr());
    return handler_.EndCall(args);
  }
  case 'n': case 'l': case 's': {
    // Read a number.
    double value = ReadConstant(code);
    if (ignore_zero && value == 0)
      break;  // Ignore zero constant.
    return handler_.OnNumber(value);
  }
  case 'o':
    return ReadNumericExpr(ReadOpCode());
  case 'v':
    return DoReadReference();
  default:
    reader_.ReportError("expected expression");
  }
  return NumericExpr();
}